

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myentity.cpp
# Opt level: O1

void __thiscall MyEntity::MyEntity(MyEntity *this)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  MetaSim::Entity::Entity(&this->super_Entity,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__MyEntity_0017b538;
  this->afirst = false;
  this->bfirst = false;
  this->count = 0;
  MetaSim::Event::Event(&(this->eventA).super_Event,8);
  (this->eventA).super_Event._vptr_Event = (_func_int **)&PTR__Event_0017b580;
  (this->eventA)._obj = this;
  (this->eventA)._fun = (Pmemfun)onEventA;
  *(undefined8 *)&(this->eventA).field_0x98 = 0;
  MetaSim::Event::Event(&(this->eventB).super_Event,8);
  (this->eventB).super_Event._vptr_Event = (_func_int **)&PTR__Event_0017b580;
  (this->eventB)._obj = this;
  (this->eventB)._fun = (Pmemfun)onEventB;
  *(undefined8 *)&(this->eventB).field_0x98 = 0;
  MetaSim::Event::Event(&(this->eventC).super_Event,8);
  (this->eventC).super_Event._vptr_Event = (_func_int **)&PTR__Event_0017b580;
  (this->eventC)._obj = this;
  (this->eventC)._fun = (Pmemfun)onEventC;
  *(undefined8 *)&(this->eventC).field_0x98 = 0;
  return;
}

Assistant:

MyEntity::MyEntity() : Entity(""),
		       afirst(false),
		       bfirst(false),
		       count(0),
		       eventA(this, &MyEntity::onEventA),
		       eventB(this, &MyEntity::onEventB),
		       eventC(this, &MyEntity::onEventC)
{
}